

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

int Internal_FloatArrayCompare(size_t count,float *a,float *b)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  
  fVar1 = *a;
  fVar2 = *b;
  uVar3 = 0xffffffff;
  if ((fVar2 <= fVar1) && (uVar3 = 1, fVar1 <= fVar2)) {
    uVar3 = 0;
    if (((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) && (uVar3 = 0xffffffff, NAN(fVar1))) {
      uVar3 = (uint)!NAN(fVar2);
    }
  }
  if (1 < (long)count && uVar3 == 0) {
    pfVar4 = b + 1;
    pfVar5 = a + 2;
    do {
      fVar1 = pfVar5[-1];
      fVar2 = *pfVar4;
      uVar3 = 0xffffffff;
      if ((fVar2 <= fVar1) && (uVar3 = 1, fVar1 <= fVar2)) {
        uVar3 = 0;
        if (((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) && (uVar3 = 0xffffffff, NAN(fVar1))) {
          uVar3 = (uint)!NAN(fVar2);
        }
      }
      if (uVar3 != 0) {
        return uVar3;
      }
      pfVar4 = pfVar4 + 1;
      bVar6 = pfVar5 < a + count;
      uVar3 = 0;
      pfVar5 = pfVar5 + 1;
    } while (bVar6);
  }
  return uVar3;
}

Assistant:

static int Internal_FloatArrayCompare(
  size_t count,
  const float* a,
  const float* b
  )
{
  const float* e = a + count;
  int rc = ON_CompareFloat(*a++, *b++);
  while( 0 == rc && a < e)
    rc = ON_CompareFloat(*a++, *b++);
  return rc;
}